

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# future.h
# Opt level: O0

IoctlResponse * __thiscall Future<IoctlResponse>::get(Future<IoctlResponse> *this)

{
  bool bVar1;
  element_type *peVar2;
  long in_RSI;
  IoctlResponse *in_RDI;
  IoctlResponse *in_stack_ffffffffffffffb8;
  IoctlResponse *this_00;
  undefined1 local_28 [40];
  
  this_00 = in_RDI;
  if (((*(byte *)(in_RSI + 0x30) & 1) == 0) &&
     (bVar1 = std::operator!=((shared_ptr<AsyncTask<IoctlResponse>_> *)in_RDI,
                              in_stack_ffffffffffffffb8), bVar1)) {
    peVar2 = std::
             __shared_ptr_access<AsyncTask<IoctlResponse>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<AsyncTask<IoctlResponse>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x159c11);
    (**peVar2->_vptr_AsyncTask)(local_28);
    IoctlResponse::operator=(this_00,in_stack_ffffffffffffffb8);
    IoctlResponse::~IoctlResponse((IoctlResponse *)0x159c3b);
    *(undefined1 *)(in_RSI + 0x30) = 1;
  }
  IoctlResponse::IoctlResponse(this_00,in_stack_ffffffffffffffb8);
  return in_RDI;
}

Assistant:

virtual T get() {
    if (!is_done_ && task_ != nullptr) {
      result_ = task_->get();
      is_done_ = true;
    }
    return result_;
  }